

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestResourceSpec.cxx
# Opt level: O1

ReadFileResult __thiscall
cmCTestResourceSpec::ReadFromJSONFile(cmCTestResourceSpec *this,string *filename)

{
  bool bVar1;
  bool bVar2;
  ReadFileResult RVar3;
  ReadFileResult RVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __position;
  long *plVar5;
  TopVersion version;
  Members extraFields;
  Value root;
  CharReaderBuilder builder;
  ifstream fin;
  undefined8 local_300;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  undefined1 local_2d8 [32];
  cmCTestResourceSpec *local_2b8;
  long *local_2b0;
  Members local_2a8;
  Value local_290;
  CharReaderBuilder local_268;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(filename->_M_dataplus)._M_p,_S_in);
  RVar4 = FILE_NOT_FOUND;
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    Json::Value::Value(&local_290,nullValue);
    Json::CharReaderBuilder::CharReaderBuilder(&local_268);
    bVar1 = Json::parseFromStream
                      (&local_268.super_Factory,(IStream *)local_238,&local_290,(String *)0x0);
    RVar3 = JSON_PARSE_ERROR;
    RVar4 = JSON_PARSE_ERROR;
    if (bVar1) {
      local_300 = 1;
      bVar1 = Json::Value::isObject(&local_290);
      RVar4 = DAT_00976b48;
      if (bVar1) {
        local_2f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_2f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2b8 = this;
        Json::Value::getMemberNames_abi_cxx11_(&local_2a8,&local_290);
        local_2d8._16_8_ =
             local_2f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_2d8._8_8_ =
             local_2f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_2d8._0_8_ =
             local_2f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_2f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_2a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_2f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_2a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_2f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_2a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_2a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_2a8);
        local_2b0 = DAT_00976b30;
        bVar1 = (anonymous_namespace)::RootVersionHelper == DAT_00976b30;
        if (!bVar1) {
          bVar1 = false;
          plVar5 = (anonymous_namespace)::RootVersionHelper;
          RVar4 = JSON_PARSE_ERROR;
          do {
            local_2d8._0_8_ = local_2d8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2d8,plVar5[1],*plVar5 + plVar5[1]);
            bVar2 = Json::Value::isMember(&local_290,(String *)local_2d8);
            if (bVar2) {
              local_2a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)Json::Value::operator[](&local_290,(String *)local_2d8);
              if (plVar5[4] == 0) {
                std::__throw_bad_function_call();
              }
              RVar3 = (*(code *)plVar5[5])(plVar5 + 2,&local_300,&local_2a8);
              if (RVar3 == DAT_00976b44) {
                __position = std::
                             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                       (local_2f8.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        local_2f8.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish,
                                        (String *)local_2d8);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_erase(&local_2f8,(iterator)__position._M_current);
LAB_00200b65:
                bVar2 = true;
                RVar3 = RVar4;
              }
              else {
                bVar2 = false;
              }
            }
            else {
              RVar3 = DAT_00976b48;
              if ((char)plVar5[6] == '\0') {
                local_2a8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                if (plVar5[4] == 0) {
                  std::__throw_bad_function_call();
                }
                RVar3 = (*(code *)plVar5[5])(plVar5 + 2,&local_300,&local_2a8);
                if (RVar3 == DAT_00976b44) goto LAB_00200b65;
              }
              bVar2 = false;
            }
            if ((pointer)local_2d8._0_8_ != (pointer)(local_2d8 + 0x10)) {
              operator_delete((void *)local_2d8._0_8_,(ulong)(local_2d8._16_8_ + 1));
            }
            if (!bVar2) break;
            plVar5 = plVar5 + 7;
            bVar1 = plVar5 == local_2b0;
            RVar4 = RVar3;
          } while (!bVar1);
        }
        if (bVar1) {
          RVar3 = (&DAT_00976b44)
                  [local_2f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                   local_2f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish & ~DAT_00976b4c];
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_2f8);
        this = local_2b8;
        RVar4 = RVar3;
      }
      if (RVar4 == READ_OK) {
        RVar4 = UNSUPPORTED_VERSION;
        if (((int)local_300 == 1) && (local_300._4_4_ == 0)) {
          RVar4 = cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::
                  Object<cmCTestResourceSpec>::operator()
                            ((Object<cmCTestResourceSpec> *)(anonymous_namespace)::RootHelper,this,
                             &local_290);
        }
      }
    }
    Json::CharReaderBuilder::~CharReaderBuilder(&local_268);
    Json::Value::~Value(&local_290);
  }
  std::ifstream::~ifstream(local_238);
  return RVar4;
}

Assistant:

cmCTestResourceSpec::ReadFileResult cmCTestResourceSpec::ReadFromJSONFile(
  const std::string& filename)
{
  cmsys::ifstream fin(filename.c_str());
  if (!fin) {
    return ReadFileResult::FILE_NOT_FOUND;
  }

  Json::Value root;
  Json::CharReaderBuilder builder;
  if (!Json::parseFromStream(builder, fin, &root, nullptr)) {
    return ReadFileResult::JSON_PARSE_ERROR;
  }

  TopVersion version;
  ReadFileResult result;
  if ((result = RootVersionHelper(version, &root)) !=
      ReadFileResult::READ_OK) {
    return result;
  }
  if (version.Version.Major != 1 || version.Version.Minor != 0) {
    return ReadFileResult::UNSUPPORTED_VERSION;
  }

  return RootHelper(*this, &root);
}